

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ManIncrementTravId(Gia_Man_t *p)

{
  uint uVar1;
  int *__ptr;
  long lVar2;
  ulong __nmemb;
  
  __ptr = p->pTravIds;
  if (__ptr == (int *)0x0) {
    __nmemb = (long)p->nObjs + 100;
    p->nTravIdsAlloc = (int)__nmemb;
    __ptr = (int *)calloc(__nmemb,4);
    p->pTravIds = __ptr;
    p->nTravIds = 0;
  }
  else {
    __nmemb = (ulong)(uint)p->nTravIdsAlloc;
  }
  while ((int)__nmemb < p->nObjs) {
    uVar1 = (int)__nmemb * 2;
    p->nTravIdsAlloc = uVar1;
    lVar2 = (long)(int)uVar1;
    if (__ptr == (int *)0x0) {
      __ptr = (int *)malloc(lVar2 * 4);
    }
    else {
      __ptr = (int *)realloc(__ptr,lVar2 * 4);
      uVar1 = p->nTravIdsAlloc;
      lVar2 = (long)(int)uVar1;
    }
    p->pTravIds = __ptr;
    memset(__ptr + (int)uVar1 / 2,0,lVar2 * 2 & 0x7ffffffffffffffe);
    __nmemb = (ulong)uVar1;
  }
  p->nTravIds = p->nTravIds + 1;
  return;
}

Assistant:

void Gia_ManIncrementTravId( Gia_Man_t * p )                     
{ 
    if ( p->pTravIds == NULL )
    {
        p->nTravIdsAlloc = Gia_ManObjNum(p) + 100; 
        p->pTravIds = ABC_CALLOC( int, p->nTravIdsAlloc ); 
        p->nTravIds = 0;  
    }
    while ( p->nTravIdsAlloc < Gia_ManObjNum(p) )
    {
        p->nTravIdsAlloc *= 2;
        p->pTravIds = ABC_REALLOC( int, p->pTravIds, p->nTravIdsAlloc );
        memset( p->pTravIds + p->nTravIdsAlloc/2, 0, sizeof(int) * p->nTravIdsAlloc/2 );
    }
    p->nTravIds++;                                                    
}